

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void clip_component(opj_image_comp_t *component,OPJ_UINT32 precision)

{
  OPJ_INT32 *pOVar1;
  uint uVar2;
  ulong uVar3;
  OPJ_UINT32 *l_data_1;
  OPJ_INT32 min;
  OPJ_INT32 max;
  OPJ_INT32 *l_data;
  OPJ_UINT32 umax;
  OPJ_SIZE_T len;
  OPJ_SIZE_T i;
  OPJ_UINT32 precision_local;
  opj_image_comp_t *component_local;
  
  l_data._4_4_ = 0xffffffff;
  uVar3 = (ulong)component->w * (ulong)component->h;
  if (precision < 0x20) {
    l_data._4_4_ = (1 << ((byte)precision & 0x1f)) - 1;
  }
  if (component->sgnd == 0) {
    pOVar1 = component->data;
    for (len = 0; len < uVar3; len = len + 1) {
      if (l_data._4_4_ < (uint)pOVar1[len]) {
        pOVar1[len] = l_data._4_4_;
      }
    }
  }
  else {
    pOVar1 = component->data;
    uVar2 = l_data._4_4_ >> 1;
    for (len = 0; len < uVar3; len = len + 1) {
      if ((int)uVar2 < pOVar1[len]) {
        pOVar1[len] = uVar2;
      }
      else if (pOVar1[len] < (int)(-1 - uVar2)) {
        pOVar1[len] = -1 - uVar2;
      }
    }
  }
  component->prec = precision;
  return;
}

Assistant:

void clip_component(opj_image_comp_t* component, OPJ_UINT32 precision)
{
    OPJ_SIZE_T i;
    OPJ_SIZE_T len;
    OPJ_UINT32 umax = (OPJ_UINT32)((OPJ_INT32) - 1);

    len = (OPJ_SIZE_T)component->w * (OPJ_SIZE_T)component->h;
    if (precision < 32) {
        umax = (1U << precision) - 1U;
    }

    if (component->sgnd) {
        OPJ_INT32* l_data = component->data;
        OPJ_INT32 max = (OPJ_INT32)(umax / 2U);
        OPJ_INT32 min = -max - 1;
        for (i = 0; i < len; ++i) {
            if (l_data[i] > max) {
                l_data[i] = max;
            } else if (l_data[i] < min) {
                l_data[i] = min;
            }
        }
    } else {
        OPJ_UINT32* l_data = (OPJ_UINT32*)component->data;
        for (i = 0; i < len; ++i) {
            if (l_data[i] > umax) {
                l_data[i] = umax;
            }
        }
    }
    component->prec = precision;
}